

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acceleration_stabilization.cpp
# Opt level: O1

int test(void)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uint k;
  long lVar4;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *pdVar5;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *pdVar6;
  byte bVar7;
  Vector x0;
  Vector uk;
  IndexedMatrixArray u;
  DynamicalSystemSimulator sim;
  IMUFixedContactDynamicalSystem imu;
  void *local_3c8;
  long local_3c0;
  void *local_3b8 [2];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  void *local_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  IndexedMatrixArray local_340 [8];
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_338 [80];
  undefined4 local_2e8 [2];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  DynamicalSystemSimulator local_290 [240];
  IMUFixedContactDynamicalSystem local_1a0 [376];
  
  bVar7 = 0;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_2e8);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_340);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
  IMUFixedContactDynamicalSystem(local_1a0,0.005);
  stateObservation::DynamicalSystemSimulator::DynamicalSystemSimulator(local_290);
  stateObservation::DynamicalSystemSimulator::setDynamicsFunctor
            ((DynamicalSystemFunctorBase *)local_290);
  local_398 = (void *)0x12;
  uStack_388 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_3c8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_398);
  lVar4 = 0;
  do {
    iVar2 = rand();
    if (local_3c0 <= lVar4) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    dVar1 = (double)iVar2 / 2147483647.0 + -0.5;
    *(double *)((long)local_3c8 + lVar4 * 8) = dVar1 + dVar1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x12);
  stateObservation::DynamicalSystemSimulator::setState((Matrix *)local_290,(uint)&local_3c8);
  uVar3 = stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::getInputSize();
  local_398 = (void *)(ulong)uVar3;
  uStack_388 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_3b8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_398);
  uVar3 = 0;
  do {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_398,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3b8);
    stateObservation::IndexedMatrixArray::setValue(local_340,(Matrix *)&local_398,uVar3);
    free(local_398);
    stateObservation::DynamicalSystemSimulator::setInput
              ((Matrix *)local_290,
               (uint)(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3b8);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 2000);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::setSamplingPeriod(0.005);
  stateObservation::DynamicalSystemSimulator::simulateDynamicsTo((uint)local_290);
  stateObservation::DynamicalSystemSimulator::getStateArray((uint)&local_398,(uint)local_290);
  local_2e8[0] = local_398._0_4_;
  local_3a8 = local_2e0;
  uStack_3a0 = uStack_2d8;
  pdVar5 = (deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)&local_390;
  pdVar6 = (deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)&local_2e0;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pdVar6 = *(undefined8 *)pdVar5;
    pdVar5 = pdVar5 + (ulong)bVar7 * -0x10 + 8;
    pdVar6 = pdVar6 + (ulong)bVar7 * -0x10 + 8;
  }
  local_390 = local_2e0;
  uStack_388 = uStack_2d8;
  local_380 = local_2d0;
  uStack_378 = uStack_2c8;
  local_370 = local_2c0;
  uStack_368 = uStack_2b8;
  local_360 = local_2b0;
  uStack_358 = uStack_2a8;
  local_350 = local_2a0;
  uStack_348 = uStack_298;
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::clear((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)&local_390);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)&local_390);
  stateObservation::IndexedMatrixArray::writeInFile((char *)local_2e8);
  free(local_3b8[0]);
  free(local_3c8);
  stateObservation::DynamicalSystemSimulator::~DynamicalSystemSimulator(local_290);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
  ~IMUFixedContactDynamicalSystem(local_1a0);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_338);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)&local_2e0);
  return 0;
}

Assistant:

int test()
{
    /// The number of samples
    const unsigned kmax=2000;

    ///sampling period
    const double dt=5e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=15;
    (void)measurementSize;
    (void)inputSize;


    for (unsigned i = 0; i<1; ++i)
    {
    	///The array containing all the states, the measurements and the inputs
    	IndexedMatrixArray x;
    	IndexedMatrixArray u;

        ///simulation of the signal
        /// the IMU dynamical system functor
        flexibilityEstimation::IMUFixedContactDynamicalSystem imu(dt);

        ///the simulator initalization
        DynamicalSystemSimulator sim;
        sim.setDynamicsFunctor( & imu); // choice of the dynamical system

        Vector x0=(Vector::Zero(stateSize,1));

        ///initialization of the state vector
        for (unsigned j= 0; j<stateSize ;++j)
        	x0[j]=(double(rand())/RAND_MAX -0.5)*2;

        sim.setState(x0,0);

        Vector uk=Vector::Zero(imu.getInputSize(),1);


        for (unsigned k=0;k<kmax;++k)
        {
        	u.setValue(uk,k);

            ///give the input to the simulator
            ///we only need to give one value and the
            ///simulator takes automatically the appropriate value
            sim.setInput(uk,k);
        }

        ///set the sampling perdiod to the functor
        imu.setSamplingPeriod(dt);

        sim.simulateDynamicsTo(kmax);

        x = sim.getStateArray(1,kmax);

        x.writeInFile("state.dat");
        //std::cout <<x[kmax].norm ()<< " "<< x[kmax].transpose() << std::endl;
    }

    return 0;

}